

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::ShowDebugLogWindow(bool *p_open)

{
  bool bVar1;
  ImGuiWindow *pIVar2;
  char *base;
  float fVar3;
  float fVar4;
  int line_no;
  ImGuiListClipper clipper;
  ImGuiDebugLogFlags backup_log_flags;
  ImGuiDebugLogFlags all_enable_flags;
  ImGuiContext *g;
  ImGuiWindowFlags in_stack_0000039c;
  bool *in_stack_000003a0;
  char *in_stack_000003a8;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  ImGuiTextIndex *in_stack_ffffffffffffff50;
  int n;
  ImVec2 *in_stack_ffffffffffffff58;
  ImGuiListClipper *in_stack_ffffffffffffff60;
  float center_y_ratio;
  undefined8 in_stack_ffffffffffffff68;
  ImGuiDebugLogFlags IVar5;
  char *in_stack_ffffffffffffff70;
  ImGuiTextIndex *this;
  int local_68;
  int local_50;
  int local_4c;
  float in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  ImGuiListClipper *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  char *in_stack_ffffffffffffffd0;
  ImVec2 local_24;
  undefined4 local_1c;
  ImVec2 local_18;
  ImGuiContext *local_10;
  
  IVar5 = (ImGuiDebugLogFlags)((ulong)in_stack_ffffffffffffff68 >> 0x20);
  local_10 = GImGui;
  if (((GImGui->NextWindowData).Flags & 2U) == 0) {
    fVar3 = GetFontSize();
    ImVec2::ImVec2(&local_18,0.0,fVar3 * 12.0);
    SetNextWindowSize(&local_18,4);
  }
  bVar1 = Begin(in_stack_000003a8,in_stack_000003a0,in_stack_0000039c);
  if ((bVar1) && (pIVar2 = GetCurrentWindow(), pIVar2->BeginCount < 2)) {
    local_1c = 0x7f;
    CheckboxFlags((char *)in_stack_ffffffffffffff50,
                  (int *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),0);
    SetItemTooltip("(except InputRouting which is spammy)");
    ShowDebugLogFlag(in_stack_ffffffffffffff70,IVar5);
    ShowDebugLogFlag(in_stack_ffffffffffffff70,IVar5);
    ShowDebugLogFlag(in_stack_ffffffffffffff70,IVar5);
    ShowDebugLogFlag(in_stack_ffffffffffffff70,IVar5);
    ShowDebugLogFlag(in_stack_ffffffffffffff70,IVar5);
    ShowDebugLogFlag(in_stack_ffffffffffffff70,IVar5);
    ShowDebugLogFlag(in_stack_ffffffffffffff70,IVar5);
    ShowDebugLogFlag(in_stack_ffffffffffffff70,IVar5);
    bVar1 = SmallButton((char *)in_stack_ffffffffffffff60);
    if (bVar1) {
      ImGuiTextBuffer::clear((ImGuiTextBuffer *)0x2075ca);
      ImGuiTextIndex::clear(in_stack_ffffffffffffff50);
    }
    SameLine(0.0,-1.0);
    bVar1 = SmallButton((char *)in_stack_ffffffffffffff60);
    if (bVar1) {
      ImGuiTextBuffer::c_str(&local_10->DebugLogBuf);
      SetClipboardText((char *)in_stack_ffffffffffffff50);
    }
    SameLine(0.0,-1.0);
    bVar1 = SmallButton((char *)in_stack_ffffffffffffff60);
    if (bVar1) {
      OpenPopup((char *)in_stack_ffffffffffffff60,
                (ImGuiPopupFlags)((ulong)in_stack_ffffffffffffff58 >> 0x20));
    }
    bVar1 = BeginPopup((char *)in_stack_ffffffffffffff58,
                       (ImGuiWindowFlags)((ulong)in_stack_ffffffffffffff50 >> 0x20));
    if (bVar1) {
      CheckboxFlags((char *)in_stack_ffffffffffffff50,
                    (int *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),0);
      BeginDisabled(SUB81((ulong)in_stack_ffffffffffffff50 >> 0x38,0));
      CheckboxFlags((char *)in_stack_ffffffffffffff50,
                    (int *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),0);
      EndDisabled();
      EndPopup();
    }
    ImVec2::ImVec2(&local_24,0.0,0.0);
    BeginChild((char *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
               (ImGuiChildFlags)((ulong)in_stack_ffffffffffffff50 >> 0x20),
               (ImGuiWindowFlags)in_stack_ffffffffffffff50);
    IVar5 = local_10->DebugLogFlags;
    local_10->DebugLogFlags = local_10->DebugLogFlags & 0xffffffef;
    ImGuiListClipper::ImGuiListClipper((ImGuiListClipper *)0x20771d);
    ImGuiTextIndex::size(&local_10->DebugLogIndex);
    ImGuiListClipper::Begin
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
    while (bVar1 = ImGuiListClipper::Step(in_stack_ffffffffffffff60), bVar1) {
      for (local_68 = local_50; n = (int)((ulong)in_stack_ffffffffffffff50 >> 0x20),
          local_68 < local_4c; local_68 = local_68 + 1) {
        this = &local_10->DebugLogIndex;
        ImGuiTextBuffer::c_str(&local_10->DebugLogBuf);
        base = ImGuiTextIndex::get_line_begin
                         ((ImGuiTextIndex *)in_stack_ffffffffffffff60,
                          (char *)in_stack_ffffffffffffff58,n);
        in_stack_ffffffffffffff58 = (ImVec2 *)&local_10->DebugLogIndex;
        in_stack_ffffffffffffff60 =
             (ImGuiListClipper *)ImGuiTextBuffer::c_str(&local_10->DebugLogBuf);
        in_stack_ffffffffffffff50 =
             (ImGuiTextIndex *)
             ImGuiTextIndex::get_line_end(this,base,(int)((ulong)in_stack_ffffffffffffff60 >> 0x20))
        ;
        DebugTextUnformattedWithLocateItem(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
      }
    }
    local_10->DebugLogFlags = IVar5;
    fVar3 = GetScrollY();
    center_y_ratio = (float)((ulong)in_stack_ffffffffffffff60 >> 0x20);
    fVar4 = GetScrollMaxY();
    if (fVar4 <= fVar3) {
      SetScrollHereY(center_y_ratio);
    }
    EndChild();
    End();
    ImGuiListClipper::~ImGuiListClipper((ImGuiListClipper *)0x2078a8);
  }
  else {
    End();
  }
  return;
}

Assistant:

void ImGui::ShowDebugLogWindow(bool* p_open)
{
    ImGuiContext& g = *GImGui;
    if (!(g.NextWindowData.Flags & ImGuiNextWindowDataFlags_HasSize))
        SetNextWindowSize(ImVec2(0.0f, GetFontSize() * 12.0f), ImGuiCond_FirstUseEver);
    if (!Begin("Dear ImGui Debug Log", p_open) || GetCurrentWindow()->BeginCount > 1)
    {
        End();
        return;
    }

    ImGuiDebugLogFlags all_enable_flags = ImGuiDebugLogFlags_EventMask_ & ~ImGuiDebugLogFlags_EventInputRouting;
    CheckboxFlags("All", &g.DebugLogFlags, all_enable_flags);
    SetItemTooltip("(except InputRouting which is spammy)");

    ShowDebugLogFlag("ActiveId", ImGuiDebugLogFlags_EventActiveId);
    ShowDebugLogFlag("Clipper", ImGuiDebugLogFlags_EventClipper);
    ShowDebugLogFlag("Focus", ImGuiDebugLogFlags_EventFocus);
    ShowDebugLogFlag("IO", ImGuiDebugLogFlags_EventIO);
    ShowDebugLogFlag("Nav", ImGuiDebugLogFlags_EventNav);
    ShowDebugLogFlag("Popup", ImGuiDebugLogFlags_EventPopup);
    ShowDebugLogFlag("Selection", ImGuiDebugLogFlags_EventSelection);
    ShowDebugLogFlag("InputRouting", ImGuiDebugLogFlags_EventInputRouting);

    if (SmallButton("Clear"))
    {
        g.DebugLogBuf.clear();
        g.DebugLogIndex.clear();
    }
    SameLine();
    if (SmallButton("Copy"))
        SetClipboardText(g.DebugLogBuf.c_str());
    SameLine();
    if (SmallButton("Configure Outputs.."))
        OpenPopup("Outputs");
    if (BeginPopup("Outputs"))
    {
        CheckboxFlags("OutputToTTY", &g.DebugLogFlags, ImGuiDebugLogFlags_OutputToTTY);
#ifndef IMGUI_ENABLE_TEST_ENGINE
        BeginDisabled();
#endif
        CheckboxFlags("OutputToTestEngine", &g.DebugLogFlags, ImGuiDebugLogFlags_OutputToTestEngine);
#ifndef IMGUI_ENABLE_TEST_ENGINE
        EndDisabled();
#endif
        EndPopup();
    }

    BeginChild("##log", ImVec2(0.0f, 0.0f), ImGuiChildFlags_Border, ImGuiWindowFlags_AlwaysVerticalScrollbar | ImGuiWindowFlags_AlwaysHorizontalScrollbar);

    const ImGuiDebugLogFlags backup_log_flags = g.DebugLogFlags;
    g.DebugLogFlags &= ~ImGuiDebugLogFlags_EventClipper;

    ImGuiListClipper clipper;
    clipper.Begin(g.DebugLogIndex.size());
    while (clipper.Step())
        for (int line_no = clipper.DisplayStart; line_no < clipper.DisplayEnd; line_no++)
            DebugTextUnformattedWithLocateItem(g.DebugLogIndex.get_line_begin(g.DebugLogBuf.c_str(), line_no), g.DebugLogIndex.get_line_end(g.DebugLogBuf.c_str(), line_no));
    g.DebugLogFlags = backup_log_flags;
    if (GetScrollY() >= GetScrollMaxY())
        SetScrollHereY(1.0f);
    EndChild();

    End();
}